

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_pdu.cc
# Opt level: O2

bool __thiscall
assembler::SessionPDU::append(SessionPDU *this,const_iterator begin,const_iterator end)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  SZ_com_t *param;
  pointer dest;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  const_iterator __position;
  uint uVar5;
  size_t outLen;
  uint32_t uStack_40;
  undefined4 uStack_3c;
  uint64_t local_38;
  
  this_00 = &this->buf_;
  __position._M_current =
       (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar3 = (long)__position._M_current -
          (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar3 < 0x10) {
    uVar4 = 0x10 - (int)uVar3;
    uVar5 = (int)end._M_current - (int)begin._M_current;
    if (uVar4 < uVar5) {
      uVar5 = uVar4;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )begin._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(begin._M_current + uVar5));
    if ((ulong)((long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x10) {
      return true;
    }
    lrit::getHeader<lrit::PrimaryHeader>((PrimaryHeader *)&outLen,this_00,0);
    (this->ph_).dataLength = local_38;
    (this->ph_).headerType = (undefined1)outLen;
    (this->ph_).field_0x1 = outLen._1_1_;
    (this->ph_).headerLength = outLen._2_2_;
    (this->ph_).fileType = outLen._4_1_;
    *(undefined3 *)&(this->ph_).field_0x5 = outLen._5_3_;
    (this->ph_).totalHeaderLength = uStack_40;
    *(undefined4 *)&(this->ph_).field_0xc = uStack_3c;
    __position._M_current =
         (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    uVar3 = (long)__position._M_current -
            (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    begin._M_current = begin._M_current + uVar5;
  }
  uVar5 = (this->ph_).totalHeaderLength;
  if (uVar3 < uVar5) {
    uVar5 = uVar5 - (int)uVar3;
    uVar4 = (int)end._M_current - (int)begin._M_current;
    if (uVar5 < uVar4) {
      uVar4 = uVar5;
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )begin._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(begin._M_current + uVar4));
    if ((ulong)((long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start) <
        (ulong)(this->ph_).totalHeaderLength) {
      return true;
    }
    bVar1 = completeHeader(this);
    begin._M_current = begin._M_current + uVar4;
    if (!bVar1) {
      return false;
    }
  }
  param = (this->szParam_)._M_t.super___uniq_ptr_impl<SZ_com_t_s,_std::default_delete<SZ_com_t_s>_>.
          _M_t.super__Tuple_impl<0UL,_SZ_com_t_s_*,_std::default_delete<SZ_com_t_s>_>.
          super__Head_base<0UL,_SZ_com_t_s_*,_false>._M_head_impl;
  if (param == (SZ_com_t *)0x0) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (const_iterator)
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )begin._M_current,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )end._M_current);
    return true;
  }
  dest = (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  outLen = (long)(this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)dest;
  if (begin._M_current != end._M_current) {
    iVar2 = SZ_BufftoBuffDecompress
                      (dest,&outLen,begin._M_current,(long)end._M_current - (long)begin._M_current,
                       param);
    if (iVar2 != 0) {
      return false;
    }
    __first._M_current =
         (this->szTmp_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (const_iterator)
               (this->buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,__first,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(__first._M_current + outLen));
    this->linesDone_ = this->linesDone_ + 1;
    return true;
  }
  return true;
}

Assistant:

bool SessionPDU::append(
    std::vector<uint8_t>::const_iterator begin,
    std::vector<uint8_t>::const_iterator end) {
  // Copy primary header first so we can determine total header length
  if (buf_.size() < 16) {
    size_t len = std::min(
      uint32_t(16 - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (buf_.size() < 16) {
      return true;
    }
    ph_ = lrit::getHeader<lrit::PrimaryHeader>(buf_, 0);
  }

  // Copy secondary headers verbatim
  if (ph_.totalHeaderLength > buf_.size()) {
    size_t len = std::min(
      uint32_t(ph_.totalHeaderLength - buf_.size()),
      uint32_t(end - begin));
    buf_.insert(buf_.end(), begin, begin + len);
    begin += len;
    if (ph_.totalHeaderLength > buf_.size()) {
      return true;
    }
    if (!completeHeader()) {
      return false;
    }
  }

  // Copy data verbatim if decompression parameters not set
  if (!szParam_) {
    buf_.insert(buf_.end(), begin, end);
    return true;
  }

  // Decompress otherwise
  uint8_t* out = szTmp_.data();
  size_t outLen = szTmp_.size();
  const uint8_t* dataIn = &(*begin);
  size_t dataInLen = end - begin;
  if (dataInLen == 0) {
    return true;
  }

  int rv = SZ_BufftoBuffDecompress(out, &outLen, dataIn, dataInLen, szParam_.get());
  if (rv != AEC_OK) {
    return false;
  }

  // Copy from temporary
  buf_.insert(buf_.end(), szTmp_.begin(), szTmp_.begin() + outLen);
  linesDone_++;
  return true;
}